

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void dump_pref_file(_func_void_ang_file_ptr *dump,char *title,wchar_t row)

{
  _Bool _Var1;
  char *pcVar2;
  char local_428 [8];
  char buf [1024];
  wchar_t row_local;
  char *title_local;
  _func_void_ang_file_ptr *dump_local;
  
  _Var1 = get_pref_path(title,row,local_428,0x400);
  if (_Var1) {
    _Var1 = prefs_save(local_428,dump,title);
    if (_Var1) {
      pcVar2 = strstr(title," ");
      msg("Saved %s.",pcVar2 + 1);
    }
    else {
      pcVar2 = strstr(title," ");
      msg("Failed to save %s.",pcVar2 + 1);
    }
    event_signal(EVENT_MESSAGE_FLUSH);
  }
  return;
}

Assistant:

static void dump_pref_file(void (*dump)(ang_file *), const char *title, int row)
{
	char buf[1024];

	/* Get filename from user */
	if (!get_pref_path(title, row, buf, sizeof(buf)))
		return;

	/* Try to save */
	if (prefs_save(buf, dump, title))
		msg("Saved %s.", strstr(title, " ") + 1);
	else
		msg("Failed to save %s.", strstr(title, " ") + 1);

	event_signal(EVENT_MESSAGE_FLUSH);

	return;
}